

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

int32_t icu_63::calcStringSetLength(uint32_t *set,char *s)

{
  byte bVar1;
  int local_1c;
  char c;
  byte *pbStack_18;
  int32_t length;
  char *s_local;
  uint32_t *set_local;
  
  local_1c = 0;
  pbStack_18 = (byte *)s;
  while( true ) {
    bVar1 = *pbStack_18;
    if (bVar1 == 0) break;
    set[(int)(uint)bVar1 >> 5] = 1 << (bVar1 & 0x1f) | set[(int)(uint)bVar1 >> 5];
    local_1c = local_1c + 1;
    pbStack_18 = pbStack_18 + 1;
  }
  return local_1c;
}

Assistant:

static int32_t
calcStringSetLength(uint32_t set[8], const char *s) {
    int32_t length=0;
    char c;

    while((c=*s++)!=0) {
        SET_ADD(set, c);
        ++length;
    }
    return length;
}